

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

bool __thiscall bloaty::ThreadSafeIterIndex::TryGetError(ThreadSafeIterIndex *this,string *error)

{
  byte bVar1;
  string *in_RSI;
  lock_guard<std::mutex> *in_RDI;
  bool bVar2;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffb8;
  
  std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffb8);
  bVar1 = std::__cxx11::string::empty();
  bVar2 = (bVar1 & 1) == 0;
  if (bVar2) {
    std::__cxx11::string::operator=(in_RSI,(string *)(in_RDI + 1));
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1a5b61);
  return bVar2;
}

Assistant:

bool TryGetError(std::string* error) {
    std::lock_guard<std::mutex> lock(mutex_);
    if (error_.empty()) {
      return false;
    } else {
      *error = error_;
      return true;
    }
  }